

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumparray.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  string arrayName;
  string sourceFilename;
  string headerFilename;
  ofstream fout;
  ifstream fin;
  long local_b88;
  byte abStack_b70 [488];
  char buffer [2391];
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)&sourceFilename,argv[1],(allocator *)buffer);
    std::__cxx11::string::string((string *)&headerFilename,argv[2],(allocator *)buffer);
    std::__cxx11::string::string((string *)&arrayName,argv[3],(allocator *)buffer);
    std::ifstream::ifstream(&fin,(string *)&sourceFilename,_S_bin);
    std::ofstream::ofstream(&fout,(string *)&headerFilename,_S_out);
    if ((abStack_b70[*(long *)(_fin + -0x18)] & 5) == 0) {
      poVar2 = std::operator<<((ostream *)&fout,"#include <cstddef>");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>((ostream *)&fout);
      poVar2 = std::operator<<((ostream *)&fout,"static const char ");
      poVar2 = std::operator<<(poVar2,(string *)&arrayName);
      poVar2 = std::operator<<(poVar2,"[] = {");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar5 = 0;
      do {
        std::istream::read((char *)&fin,(long)buffer);
        lVar6 = 0;
        if (0 < local_b88) {
          lVar6 = local_b88;
        }
        for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
          cVar1 = buffer[lVar4];
          uVar3 = (int)cVar1 + 0x100;
          if (-1 < cVar1) {
            uVar3 = (int)cVar1;
          }
          if (0x7f < uVar3) {
            std::operator<<((ostream *)&fout,"-");
          }
          poVar2 = std::operator<<((ostream *)&fout,"0x");
          *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
          poVar2 = std::operator<<(poVar2,0x30);
          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::operator<<(poVar2,", ");
          iVar5 = iVar5 + 1;
          if (iVar5 == 0x14) {
            iVar5 = 0;
            std::endl<char,std::char_traits<char>>((ostream *)&fout);
          }
        }
      } while (0 < local_b88);
      if (0 < iVar5) {
        std::endl<char,std::char_traits<char>>((ostream *)&fout);
      }
      poVar2 = std::operator<<((ostream *)&fout,"};");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::endl<char,std::char_traits<char>>((ostream *)&fout);
      poVar2 = std::operator<<((ostream *)&fout,"size_t ");
      poVar2 = std::operator<<(poVar2,(string *)&arrayName);
      poVar2 = std::operator<<(poVar2,"_length = sizeof(");
      poVar2 = std::operator<<(poVar2,(string *)&arrayName);
      poVar2 = std::operator<<(poVar2,") / sizeof(char);");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ifstream::close();
      std::ofstream::close();
      iVar5 = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Can\'t open file ");
      poVar2 = std::operator<<(poVar2,(string *)&sourceFilename);
      poVar2 = std::operator<<(poVar2,"!");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar5 = 1;
    }
    std::ofstream::~ofstream(&fout);
    std::ifstream::~ifstream(&fin);
    std::__cxx11::string::~string((string *)&arrayName);
    std::__cxx11::string::~string((string *)&headerFilename);
    std::__cxx11::string::~string((string *)&sourceFilename);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," <sourceFile> <headerFile> <arrayName>");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 4) {
        std::cerr << "Usage: " << argv[0] << " <sourceFile> <headerFile> <arrayName>" << std::endl;
        return 1;
    }

    std::string sourceFilename(argv[1]);
    std::string headerFilename(argv[2]);
    std::string arrayName(argv[3]);

    std::ifstream fin(sourceFilename, std::ios::binary);
    std::ofstream fout(headerFilename);

    if (!fin) {
        std::cerr << "Can't open file " << sourceFilename << "!" << std::endl;
        return 1;
    }

    // #include <cstddef>
    //
    // static const char <arrayName>[] = {
    //  /*... hexadecimal data from source file ...*/
    // };
    //
    // size_t <arrayName>_length = sizeof(<arrayName>) / sizeof(char);

    fout << "#include <cstddef>" << std::endl;
    fout << std::endl;
    fout << "static const char " << arrayName << "[] = {" << std::endl;

    char buffer[2391];
    const int maxBytesInLine = 120 / 6;
    int bytesInLine = 0;

    std::streamsize n;
    do {
        fin.read(buffer, sizeof(buffer) / sizeof(char));
        n = fin.gcount();
        for (std::streamsize i = 0; i < n; ++i) {
            unsigned int value = (unsigned int) buffer[i];
            if (value > 0xff) {
                value -= 0xffffff00;
            }
            if (value >= 128) {
                fout << "-";
                value = 256 - value;
            }
            fout << "0x" << std::setw(2) << std::setfill('0') << std::hex << value << ", ";
            ++bytesInLine;
            if (bytesInLine == maxBytesInLine) {
                fout << std::endl;
                bytesInLine = 0;
            }
        }
    } while (n > 0);

    if (bytesInLine > 0)
        fout << std::endl;

    fout << "};" << std::endl;
    fout << std::endl;
    fout << "size_t " << arrayName << "_length = sizeof(" << arrayName << ") / sizeof(char);" << std::endl;

    fin.close();
    fout.close();

    return 0;
}